

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 24点.cpp
# Opt level: O0

double cal_24(double a,char c,double b)

{
  code *pcVar1;
  double b_local;
  char c_local;
  double a_local;
  undefined8 local_8;
  
  if (c == '+') {
    local_8 = a + b;
  }
  else if (c == '-') {
    local_8 = a - b;
  }
  else if (c == '*') {
    local_8 = a * b;
  }
  else {
    if (c != '/') {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_8 = a / b;
  }
  return local_8;
}

Assistant:

double cal_24(double a, char c,double b)
{
    if (c=='+')
    {
        return (double)a+(double)b;
    }
    if (c=='-')
    {
        return (double)a-(double)b;
    }
    if (c=='*')
    {
        return (double)a*(double)b;
    }
    if (c=='/')
    {
        return (double)a/(double)b;
    }
}